

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermediateParser.cpp
# Opt level: O2

unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __thiscall
cs222::IntermediateParser::next(IntermediateParser *this)

{
  string *__s;
  size_t *__args_1;
  bitset<6UL> *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  Format FVar3;
  istream *piVar4;
  unsigned_long addr;
  const_iterator cVar5;
  long lVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  Parser *in_RSI;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string token;
  string operation;
  string lookahead;
  Operand_pair temp;
  smatch match;
  string label;
  string comment;
  string operandsToken;
  Operand_pair operands;
  stringstream sstream;
  
  __s = &in_RSI->line;
  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (in_RSI->inputStream,(string *)__s);
  if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
LAB_00127ad9:
    (this->super_Parser)._vptr_Parser = (_func_int **)0x0;
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  in_RSI->lineNumber = in_RSI->lineNumber + 1;
  (in_RSI->flags).super__Base_bitset<1UL>._M_w = 0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sstream,"^\\s*$",0x10);
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (__s,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sstream,0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&sstream);
  if ((bVar2) ||
     (((byte)in_RSI->inputStream[*(long *)(*(long *)in_RSI->inputStream + -0x18) + 0x20] & 5) != 0))
  goto LAB_00127ad9;
  std::__cxx11::stringstream::stringstream((stringstream *)&sstream,(string *)__s,_S_out|_S_in);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  Parser::advanceToken(&sstream,&token);
  Parser::advanceToken(&sstream,&token);
  if (*token._M_dataplus._M_p == '.') {
    (**in_RSI->_vptr_Parser)(this);
    goto LAB_00128120;
  }
  addr = std::__cxx11::stoul(&token,(size_t *)0x0,0x10);
  Parser::advanceToken(&sstream,&token);
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  operation._M_dataplus._M_p = (pointer)&operation.field_2;
  operation._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  operation.field_2._M_local_buf[0] = '\0';
  operandsToken._M_dataplus._M_p = (pointer)&operandsToken.field_2;
  operandsToken._M_string_length = 0;
  operandsToken.field_2._M_local_buf[0] = '\0';
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&operands);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  bVar2 = isDirective(&token);
  __args_1 = &in_RSI->lineNumber;
  if ((bVar2) || (bVar2 = isOperation(&token), bVar2)) {
LAB_00127d04:
    Parser::parseOperation(in_RSI,&token,&operation);
    bVar2 = isOperation(&operation);
    this_00 = &in_RSI->flags;
    if (bVar2) {
      cVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)OpTable_abi_cxx11_,&operation);
      FVar3 = Operation::getValidFormat
                        ((Operation *)
                         ((long)cVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                                ._M_cur + 0x28));
      if ((FVar3 == FORMAT_1) || (bVar2 = std::operator==(&operation,"RSUB"), bVar2)) {
        Parser::advanceToken(&sstream,&token);
        std::__cxx11::string::_M_assign((string *)&comment);
        Parser::flushRestToToken(&sstream,&token);
        std::__cxx11::string::append((string *)&comment);
        std::
        make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
                  ((unsigned_long *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,__s
                   ,&label,(Operand *)&operation,&operands.first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &operands.second,&operandsToken,(bitset<6UL> *)&comment);
        Instruction::setAddress((Instruction *)(this->super_Parser)._vptr_Parser,addr);
        goto LAB_001280e2;
      }
    }
    lookahead._M_dataplus._M_p = (pointer)&lookahead.field_2;
    lookahead._M_string_length = 0;
    lookahead.field_2._M_local_buf[0] = '\0';
    lVar6 = std::istream::tellg();
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)&temp,(ulong)__s);
      std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
      std::__cxx11::string::~string((string *)&temp);
    }
    _Var1._M_p = lookahead._M_dataplus._M_p;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<int(*)(int)>>
                      (lookahead._M_dataplus._M_p,
                       lookahead._M_dataplus._M_p + lookahead._M_string_length,isspace);
    std::__cxx11::string::substr((ulong)&temp,(ulong)&lookahead);
    std::__cxx11::string::operator=((string *)&lookahead,(string *)&temp);
    std::__cxx11::string::~string((string *)&temp);
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    match._M_begin._M_current = (char *)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,
               "^\\=?C\'[A-Za-z0-9\\s]+\'",0x10);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&lookahead,&match,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&temp);
    if (bVar2) {
      this_01 = match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x48) {
        this_01 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      if (match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_01 = match.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -3;
      }
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((string_type *)&temp,this_01);
      std::__cxx11::string::operator=((string *)&token,(string *)&temp);
      std::__cxx11::string::~string((string *)&temp);
      std::istream::seekg((long)&sstream,
                          ((int)_Var7._M_current - (int)_Var1._M_p) + (int)token._M_string_length);
    }
    else {
      Parser::advanceToken(&sstream,&token);
    }
    std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>(&temp);
    bVar2 = Parser::parseOperands(in_RSI,&token,&temp);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&operandsToken);
      std::pair<cs222::Operand,_cs222::Operand>::operator=(&operands,&temp);
      bVar2 = isOperation(&operation);
      if (bVar2) {
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)OpTable_abi_cxx11_,&operation);
        FVar3 = Operation::getValidFormat
                          ((Operation *)
                           ((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                                  ._M_cur + 0x28));
        if (((FVar3 == FORMAT_3_4) && (bVar2 = std::bitset<6UL>::test(this_00,5), !bVar2)) &&
           (bVar2 = std::bitset<6UL>::test(this_00,4), !bVar2)) {
          std::bitset<6UL>::set(this_00,5,true);
          std::bitset<6UL>::set(this_00,4,true);
        }
      }
      Parser::advanceToken(&sstream,&token);
    }
    std::__cxx11::string::_M_assign((string *)&comment);
    Parser::flushRestToToken(&sstream,&token);
    std::__cxx11::string::append((string *)&comment);
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,__s,
               &label,(Operand *)&operation,&operands.first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&operands.second
               ,&operandsToken,(bitset<6UL> *)&comment);
    Instruction::setAddress((Instruction *)(this->super_Parser)._vptr_Parser,addr);
    std::pair<cs222::Operand,_cs222::Operand>::~pair(&temp);
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&match);
    std::__cxx11::string::~string((string *)&lookahead);
  }
  else {
    std::__cxx11::string::substr((ulong)&temp,(ulong)&token);
    bVar2 = isOperation((string *)&temp);
    std::__cxx11::string::~string((string *)&temp);
    if (bVar2) goto LAB_00127d04;
    bVar2 = std::operator==(&token,"*");
    if (!bVar2) {
      Parser::parseLabel(in_RSI,&token,&label);
      Parser::advanceToken(&sstream,&token);
      goto LAB_00127d04;
    }
    std::__cxx11::string::_M_assign((string *)&label);
    Parser::advanceToken(&sstream,&token);
    std::__cxx11::string::_M_assign((string *)&operation);
    Operand::Operand(&temp.first);
    Operand::Operand((Operand *)&lookahead);
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand,cs222::Operand,char_const(&)[1],char_const(&)[1],std::bitset<6ul>>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,__s,
               &label,(Operand *)&operation,&temp.first,(char (*) [1])&lookahead,
               (char (*) [1])0x12978d,(bitset<6UL> *)0x12978d);
    std::__cxx11::string::~string((string *)&lookahead._M_string_length);
    std::__cxx11::string::~string((string *)&temp.first.value);
    Instruction::setAddress((Instruction *)(this->super_Parser)._vptr_Parser,addr);
  }
LAB_001280e2:
  std::__cxx11::string::~string((string *)&comment);
  std::pair<cs222::Operand,_cs222::Operand>::~pair(&operands);
  std::__cxx11::string::~string((string *)&operandsToken);
  std::__cxx11::string::~string((string *)&operation);
  std::__cxx11::string::~string((string *)&label);
LAB_00128120:
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstream);
  return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Instruction> IntermediateParser::next() {

        if (std::getline(inputStream, line))
        {
            lineNumber += 1;
            flags.reset();

            // Stop on empty line
            if (std::regex_match(line, std::regex("^\\s*$")))
                return nullptr;
            // Reached end of stream?
            if (!inputStream)
            {
                return nullptr;
            }

            std::stringstream sstream(line);
            std::string token;

            advanceToken(sstream, token);// Skipping line number.

            advanceToken(sstream, token);// Expecting address.

            if (token[0] == '.') {// Skip comment lines.
                return this->next();
            }

            std::size_t address;
            address = std::stoul(token, nullptr, 16);

            advanceToken(sstream, token);

            std::string label;
            std::string operation;
            std::string operandsToken;
            Operand_pair operands;
            std::string comment;

            if (!(
                    isDirective(token) ||
                    isOperation(token) ||
                    isOperation(token.substr(1))))
            {
                if (token == "*") { // Literal found.
                    label = token;
                    advanceToken(sstream, token);
                    operation = token;
                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            Operand(), Operand(), "", "", std::bitset<6>());

                    (*ptr).setAddress(address);

                    return ptr;
                } else {
                    parseLabel(token, label);
                    advanceToken(sstream, token);
                }
            }

            parseOperation(token, operation);

            if (isOperation(operation))
            {
                Instruction::Format fmt =
                        OpTable.find(operation)->second.getValidFormat();
                if (fmt == Instruction::FORMAT_1 || operation == "RSUB")
                {
                    advanceToken(sstream, token);
                    comment = token;
                    flushRestToToken(sstream, token);
                    comment += token;

                    std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            operands.first, operands.second,
                            operandsToken, comment, flags);

                    (*ptr).setAddress(address);

                    return ptr;
                }
            }

            // Corner case: character constants
            // and literals can have spaces
            std::string lookahead;
            size_t lookahead_start = sstream.tellg();
            if (lookahead_start != -1)
            {
                lookahead = line.substr(lookahead_start);
            }
            size_t first_non_space = std::distance(
                    lookahead.begin(),
                    find_if_not(lookahead.begin(), lookahead.end(), isspace));
            lookahead = lookahead.substr(first_non_space);
            std::smatch match;
            if (std::regex_match(
                    lookahead,
                    match,
                    std::regex("^\\=?C'[A-Za-z0-9\\s]+'")))
            {
                token = match[0];
                sstream.seekg(
                        first_non_space + token.length(), std::ios_base::cur);
            }
            else
            {
                advanceToken(sstream, token);
            }

            Operand_pair temp;
            if (parseOperands(token, temp))
            {
                operandsToken = token;
                operands = temp;
                // SIC/XE Simple Addressing
                if (isOperation(operation))
                {
                    Instruction::Format fmt =
                            cs222::OpTable.find(operation)->second.getValidFormat();
                    if (fmt == Instruction::FORMAT_3_4 && !(
                            flags.test(Instruction::FLAG_INDIRECT) ||
                            flags.test(Instruction::FLAG_IMMEDIATE)))
                    {
                        flags.set(Instruction::FLAG_INDIRECT);
                        flags.set(Instruction::FLAG_IMMEDIATE);
                    }
                }
                advanceToken(sstream, token);
            }

            comment = token;
            flushRestToToken(sstream, token);
            comment += token;

            std::unique_ptr<Instruction> ptr = std::make_unique<Instruction>(
                    lineNumber, line, label, operation,
                    operands.first, operands.second,
                    operandsToken, comment, flags);

            (*ptr).setAddress(address);

            return ptr;
        }

        return nullptr;
    }